

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.cc
# Opt level: O0

void init_big_int(module *m)

{
  return_value_policy local_12;
  type local_11;
  module *local_10;
  module *m_local;
  
  local_12 = reference;
  local_10 = m;
  pybind11::module_::def<init_big_int(pybind11::module_&)::__0,pybind11::return_value_policy>
            (m,"constant",&local_11,&local_12);
  return;
}

Assistant:

void init_big_int(py::module &m) {
    m.def(
        "constant",
        [](const py::object &obj, uint64_t width, bool is_signed) {
            auto num_bits = _PyLong_NumBits(obj.ptr());

            if (num_bits > width)
                throw std::invalid_argument(
                    fmt::format("Width ({0}) too small for constant value", width));
            if (num_bits <= 64) {
                auto v = PyLong_AsLongLong(obj.ptr());
                auto &c = kratos::Const::constant(v, width, is_signed);
                return c.shared_from_this();
            }
            auto *format = _PyLong_Format(obj.ptr(), 16);
            auto str_value = py::cast<std::string>(format);
            bool negative = false;
            if (str_value[0] == '-') {
                if (!is_signed)
                    throw std::invalid_argument(
                        "Constant value is signed but argument says otherwise");
                negative = true;
                str_value = str_value.substr(1);
            }
            // remove 0x
            str_value = str_value.substr(2);
            auto &c = kratos::Const::constant(str_value, num_bits, negative, width, is_signed);
            return c.shared_from_this();
        },
        py::return_value_policy::reference);
}